

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O2

void __thiscall
llvm::
formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
::formatv_object(formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
                 *this,StringRef Fmt,
                tuple<llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
                *Params)

{
  _Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  local_38;
  detail local_19;
  
  formatv_object_base::formatv_object_base(&this->super_formatv_object_base,Fmt,2);
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
  .super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long>_>.
  super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01128648;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
  .super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long>_>.
  super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl.
  Item = (Params->
         super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
         ).super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long>_>.
         super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
         _M_head_impl.Item;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_01128678;
  (this->Parameters).
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
  .super__Head_base<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
  _M_head_impl.Item =
       (Params->
       super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
       ).super__Head_base<0UL,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_false>.
       _M_head_impl.Item;
  detail::
  apply_tuple_impl<llvm::formatv_object_base::create_adapters,std::tuple<llvm::detail::provider_format_adapter<unsigned_int_const&>,llvm::detail::provider_format_adapter<unsigned_long>>&,0ul,1ul>
            (&local_38,&local_19,&this->Parameters);
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  _M_move_assign(&(this->super_formatv_object_base).Adapters,&local_38);
  std::_Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

formatv_object(StringRef Fmt, Tuple &&Params)
      : formatv_object_base(Fmt, std::tuple_size<Tuple>::value),
        Parameters(std::move(Params)) {
    Adapters = apply_tuple(create_adapters(), Parameters);
  }